

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O1

void __thiscall libtorrent::aux::socks5::read_bindaddr(socks5 *this,error_code *e)

{
  ushort uVar1;
  uint uVar2;
  long lVar4;
  ushort uVar5;
  uint uVar6;
  transfer_all_t local_61;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  address local_50;
  socket *local_30;
  mutable_buffer local_28;
  uint uVar3;
  
  if (this->m_abort == false) {
    if (e->failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_50.type_._0_1_ = 0x28;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_50,e);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      uVar2 = 0;
      lVar4 = 0x160;
      do {
        uVar6 = uVar2 << 8;
        uVar3 = (uint)*(byte *)((long)&(this->super_enable_shared_from_this<libtorrent::aux::socks5>
                                       )._M_weak_this.
                                       super___weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + lVar4);
        uVar2 = uVar3 | uVar6;
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 0x164);
      local_50._0_8_ =
           (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar3 << 0x18)
           << 0x20;
      local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_50.ipv6_address_.scope_id_ = 0;
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
                (&this->m_udp_proxy_addr,&local_50);
      lVar4 = 0x164;
      uVar5 = 0;
      do {
        uVar1 = uVar5;
        uVar5 = (ushort)*(byte *)((long)&(this->
                                         super_enable_shared_from_this<libtorrent::aux::socks5>).
                                         _M_weak_this.
                                         super___weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + lVar4);
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 == 0x165);
      (this->m_udp_proxy_addr).impl_.data_.v4.sin_port = uVar5 << 8 | uVar1;
      this->m_active = true;
      this->m_failures = 0;
      local_28.size_ = 10;
      local_28.data_ = &this->m_tmp_buf;
      ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::socks5,void>
                ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                 (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_50._0_8_ = hung_up;
      local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_50.ipv6_address_.addr_.__in6_u._8_8_ = local_60;
      local_50.ipv6_address_.scope_id_ = (unsigned_long)p_Stack_58;
      local_60 = 0;
      p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_30 = &this->m_socks5_sock;
      boost::asio::detail::
      initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
      ::operator()((initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
                    *)&local_30,
                   (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                    *)&local_50,&local_28,&local_61);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.ipv6_address_.scope_id_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.ipv6_address_.scope_id_)
        ;
      }
      if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
      }
    }
  }
  return;
}

Assistant:

void socks5::read_bindaddr(error_code const& e)
{
	COMPLETE_ASYNC("socks5::read_bindaddr");

	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	m_udp_proxy_addr.address(address_v4(read_uint32(p)));
	m_udp_proxy_addr.port(read_uint16(p));

	// we're done!
	m_active = true;
	m_failures = 0;

	ADD_OUTSTANDING_ASYNC("socks5::hung_up");
	boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data(), 10)
		, std::bind(&socks5::hung_up, self(), _1));
}